

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O0

int __thiscall
helics::ipc::OwnedQueue::connect(OwnedQueue *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  char *pcVar2;
  pointer this_00;
  vector<char,_std::allocator<char>_> *this_01;
  undefined8 extraout_RAX;
  __off_t __length;
  undefined4 in_register_00000034;
  void *in_stack_00000058;
  size_t in_stack_00000060;
  offset_t in_stack_00000068;
  mode_t in_stack_00000074;
  shared_memory_object *in_stack_00000078;
  mapped_region *in_stack_00000080;
  map_options_t in_stack_00000090;
  interprocess_exception *ipe_1;
  SharedQueueState *sstate;
  mapped_region region;
  interprocess_exception *ipe;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe1c;
  SharedQueueState *in_stack_fffffffffffffe20;
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  *this_02;
  mapped_region *this_03;
  char *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  char **__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  create_only_t *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  string *__args_3;
  queue_state_t newState;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  SharedQueueState *this_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_05;
  mapped_region local_118 [3];
  undefined4 local_a4;
  char *local_a0;
  create_only_t local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char *local_40 [4];
  socklen_t local_20;
  undefined4 local_1c;
  undefined8 local_18;
  OwnedQueue *local_10;
  undefined1 local_1;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_1c = SUB84(__addr,0);
  local_20 = __len;
  local_10 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                      *)0x3f66b7);
  if (bVar1) {
    pcVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f66cb);
    boost::interprocess::
    message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::remove
              (pcVar2);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                      *)0x3f66e1);
  if (bVar1) {
    pcVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f66f5);
    boost::interprocess::shared_memory_object::remove(pcVar2);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  this_05 = &local_60;
  std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  stringTranslateToCppName((string *)in_stack_fffffffffffffe48);
  __args_3 = &this->connectionName;
  __args_1 = local_40;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_05,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20);
  __args = local_90;
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  this_04 = (SharedQueueState *)&this->stateName;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_05,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_04);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe20);
  pcVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f67c2);
  boost::interprocess::
  message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::remove(pcVar2);
  pcVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f67d4);
  boost::interprocess::shared_memory_object::remove(pcVar2);
  local_a0 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f67e6);
  local_a4 = 2;
  std::
  make_unique<boost::interprocess::shared_memory_object,boost::interprocess::create_only_t_const&,char_const*,boost::interprocess::mode_t>
            (__args,__args_1,(mode_t *)in_stack_fffffffffffffe48);
  std::
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ::operator=((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
               *)in_stack_fffffffffffffe20,
              (unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
               *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  std::
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ::~unique_ptr((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                 *)in_stack_fffffffffffffe20);
  this_02 = &this->queue_state;
  this_00 = std::
            unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
            ::operator->((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                          *)0x3f69b4);
  boost::interprocess::shared_memory_object::truncate(this_00,(char *)0x130,__length);
  std::
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ::operator*((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
               *)in_stack_fffffffffffffe20);
  uVar3 = 0xffffffff;
  this_03 = local_118;
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
            (in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000068,
             in_stack_00000060,in_stack_00000058,in_stack_00000090);
  this_01 = (vector<char,_std::allocator<char>_> *)
            boost::interprocess::mapped_region::get_address(this_03);
  SharedQueueState::SharedQueueState(in_stack_fffffffffffffe20);
  SharedQueueState::setState(this_04,(queue_state_t)((ulong)__args_3 >> 0x20));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f6a42);
  std::
  make_unique<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>,boost::interprocess::create_only_t_const&,char_const*,int&,int&>
            ((create_only_t *)this,(char **)this_05,(int *)this_04,(int *)__args_3);
  newState = (queue_state_t)((ulong)__args_3 >> 0x20);
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::operator=((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
               *)in_stack_fffffffffffffe20,
              (unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe1c,uVar3));
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                 *)this_02);
  SharedQueueState::setState(this_04,newState);
  this->mxSize = local_20;
  std::vector<char,_std::allocator<char>_>::resize(this_01,(size_type)this_03);
  this->connected = true;
  local_1 = 1;
  boost::interprocess::mapped_region::~mapped_region((mapped_region *)0x3f6c3f);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffff01;
}

Assistant:

bool OwnedQueue::connect(const std::string& connection, int maxMessages, int maxSize)
    {
        // remove the old queue if are connecting again
        if (rqueue) {
            ipc_queue::remove(connectionName.c_str());
        }
        if (queue_state) {
            ipc_state::remove(stateName.c_str());
        }
        connectionNameOrig = connection;
        connectionName = stringTranslateToCppName(connection);
        stateName = connectionName + "_state";
        ipc_queue::remove(connectionName.c_str());

        ipc_state::remove(stateName.c_str());

        try {
            queue_state = std::make_unique<ipc_state>(boostipc::create_only,
                                                      stateName.c_str(),
                                                      boostipc::read_write);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            errorString = std::string("Unable to open local state shared memory:") + ipe.what();
            return false;
        }
        queue_state->truncate(sizeof(SharedQueueState) + 256);
        // Map the whole shared memory in this process
        boostipc::mapped_region region(*queue_state, boostipc::read_write);

        auto* sstate = new (region.get_address()) SharedQueueState;
        sstate->setState(queue_state_t::startup);

        try {
            rqueue = std::make_unique<ipc_queue>(boostipc::create_only,
                                                 connectionName.c_str(),
                                                 maxMessages,
                                                 maxSize);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            errorString = std::string("Unable to open local connection:") + ipe.what();
            return false;
        }
        sstate->setState(queue_state_t::connected);
        mxSize = maxSize;
        buffer.resize(maxSize);
        connected = true;
        return true;
    }